

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O2

int __thiscall Fl_Check_Browser::item_width(Fl_Check_Browser *this,void *v)

{
  double dVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Browser_).textfont_,
             (ulong)(uint)(this->super_Fl_Browser_).textsize_);
  dVar1 = fl_width(*(char **)((long)v + 0x18));
  return (int)dVar1 + (this->super_Fl_Browser_).textsize_ + 6;
}

Assistant:

int Fl_Check_Browser::item_width(void *v) const {
	fl_font(textfont(), textsize());
	return int(fl_width(((cb_item *)v)->text)) + CHECK_SIZE + 8;
}